

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

mp_int * mp_from_integer(uintmax_t n)

{
  size_t sVar1;
  BignumInt *pBVar2;
  mp_int *pmVar3;
  size_t sVar4;
  
  pmVar3 = (mp_int *)safemalloc(1,0x10,8);
  pmVar3->nw = 1;
  pmVar3->w = &pmVar3[1].nw;
  smemclr(pmVar3 + 1,8);
  sVar1 = pmVar3->nw;
  if (sVar1 != 0) {
    pBVar2 = pmVar3->w;
    sVar4 = 0;
    do {
      pBVar2[sVar4] = n;
      sVar4 = sVar4 + 1;
    } while (sVar1 != sVar4);
  }
  return pmVar3;
}

Assistant:

mp_int *mp_from_integer(uintmax_t n)
{
    mp_int *x = mp_make_sized(
        (sizeof(n) + BIGNUM_INT_BYTES - 1) / BIGNUM_INT_BYTES);
    for (size_t i = 0; i < x->nw; i++)
        x->w[i] = n >> (i * BIGNUM_INT_BITS);
    return x;
}